

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void helicsLoadSignalHandlerCallbackNoExit
               (_func_HelicsBool_int *handler,HelicsBool useSeparateThread)

{
  int in_ESI;
  long in_RDI;
  
  (anonymous_namespace)::keyHandler = in_RDI;
  if (in_RDI == 0) {
    if (in_ESI == 0) {
      signal(2,anon_unknown.dwarf_1a6d0::signalHandlerNoExit);
    }
    else {
      signal(2,anon_unknown.dwarf_1a6d0::signalHandlerThreadedNoExit);
    }
  }
  else if (in_ESI == 0) {
    signal(2,anon_unknown.dwarf_1a6d0::signalHandlerCallbackNoExit);
  }
  else {
    signal(2,anon_unknown.dwarf_1a6d0::signalHandlerThreadedCallbackNoExit);
  }
  return;
}

Assistant:

void helicsLoadSignalHandlerCallbackNoExit(HelicsBool (*handler)(int), HelicsBool useSeparateThread)
{
    keyHandler = handler;
    if (handler != nullptr) {
        if (useSeparateThread != HELICS_FALSE) {
            static_cast<void>(signal(SIGINT, signalHandlerThreadedCallbackNoExit));
        } else {
            static_cast<void>(signal(SIGINT, signalHandlerCallbackNoExit));
        }

    } else {
        if (useSeparateThread != HELICS_FALSE) {
            static_cast<void>(signal(SIGINT, signalHandlerThreadedNoExit));
        } else {
            static_cast<void>(signal(SIGINT, signalHandlerNoExit));
        }
    }
}